

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O3

void wr_monster_memory(void)

{
  angband_constants *paVar1;
  monster_race *pmVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  monster_lore *pmVar6;
  
  wr_byte('\x02');
  if (z_info->r_max != 0) {
    lVar4 = 10;
    lVar5 = 0x10;
    uVar3 = 0;
    paVar1 = z_info;
    pmVar2 = r_info;
    pmVar6 = l_list;
    do {
      if ((*(char **)(pmVar2->flags + lVar5 + -0x5c) != (char *)0x0) &&
         ((*(short *)(pmVar6->flags + lVar4 + -0x22) != 0 ||
          (*(short *)(pmVar6->flags + lVar4 + -0x20) != 0)))) {
        wr_string(*(char **)(pmVar2->flags + lVar5 + -0x5c));
        wr_u16b(*(uint16_t *)(pmVar6->flags + lVar4 + -0x22));
        wr_u16b(*(uint16_t *)(pmVar6->flags + lVar4 + -0x20));
        paVar1 = z_info;
        pmVar2 = r_info;
        pmVar6 = l_list;
      }
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x78;
      lVar5 = lVar5 + 0xd0;
    } while (uVar3 < paVar1->r_max);
  }
  wr_string("No more monsters");
  return;
}

Assistant:

void wr_monster_memory(void)
{
	int r_idx;

	wr_byte(MFLAG_SIZE);

	for (r_idx = 0; r_idx < z_info->r_max; r_idx++) {
		struct monster_race *race = &r_info[r_idx];
		struct monster_lore *lore = &l_list[r_idx];

		/* Names and kill counts */
		if (!race->name || !(lore->pkills || lore->thefts)) continue;
		wr_string(race->name);
		wr_u16b(lore->pkills);
		wr_u16b(lore->thefts);
	}
	wr_string("No more monsters");
}